

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_parse_schema_hash
              (lys_node *sparent,lys_module *mod,char *data,char *yang_data_name,int options,
              lys_node **snode,lyb_state *lybs)

{
  lys_module *plVar1;
  int iVar2;
  size_t sVar3;
  byte local_5f [7];
  lys_module *plStack_58;
  uint8_t hash [7];
  lys_node *sibling;
  int local_48;
  uint8_t j;
  uint8_t i;
  int ret;
  int r;
  lys_node **snode_local;
  int options_local;
  char *yang_data_name_local;
  char *data_local;
  lys_module *mod_local;
  lys_node *sparent_local;
  
  if (((sparent == (lys_node *)0x0) && (mod == (lys_module *)0x0)) ||
     ((sparent != (lys_node *)0x0 && (mod != (lys_module *)0x0)))) {
    __assert_fail("(sparent || mod) && (!sparent || !mod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x38a,
                  "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                 );
  }
  local_48 = lyb_read(data,local_5f,1,lybs);
  if (local_48 < 0) {
    return -1;
  }
  yang_data_name_local = data + local_48;
  for (sibling._7_1_ = 0; ((uint)local_5f[0] & 0x80 >> (sibling._7_1_ & 0x1f)) == 0;
      sibling._7_1_ = sibling._7_1_ + 1) {
    if (8 < sibling._7_1_) {
      return -1;
    }
  }
  local_5f[sibling._7_1_] = local_5f[0];
  for (sibling._6_1_ = sibling._7_1_; sibling._6_1_ != 0; sibling._6_1_ = sibling._6_1_ - 1) {
    iVar2 = lyb_read(yang_data_name_local,local_5f + (int)(sibling._6_1_ - 1),1,lybs);
    local_48 = iVar2 + local_48;
    if (iVar2 < 0) {
      return -1;
    }
    yang_data_name_local = yang_data_name_local + iVar2;
    if (((uint)local_5f[(int)(sibling._6_1_ - 1)] & 0x80 >> (sibling._6_1_ - 1 & 0x1f)) == 0) {
      __assert_fail("hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x3a0,
                    "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                   );
    }
    if (((uint)local_5f[(int)(sibling._6_1_ - 1)] & 0x7f << (8 - (sibling._6_1_ - 1) & 0x1f)) != 0)
    {
      __assert_fail("!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1))))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x3a2,
                    "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                   );
    }
  }
  mod_local = (lys_module *)sparent;
  if ((((options & 0x1000000U) != 0) && (yang_data_name != (char *)0x0)) &&
     (mod != (lys_module *)0x0)) {
    sVar3 = strlen(yang_data_name);
    mod_local = (lys_module *)lyp_get_yang_data_template(mod,yang_data_name,(int)sVar3);
    if (mod_local == (lys_module *)0x0) {
      plStack_58 = (lys_module *)0x0;
      goto LAB_00164437;
    }
  }
  plVar1 = mod_local;
  if ((mod_local != (lys_module *)0x0) && (((ulong)mod_local->filepath & 0x4100) != 0)) {
    plStack_58 = (lys_module *)0x0;
    do {
      plStack_58 = (lys_module *)
                   lys_getnext((lys_node *)plStack_58,(lys_node *)mod_local,(lys_module *)0x0,8);
      if ((plStack_58 == (lys_module *)0x0) ||
         ((*(LYS_NODE *)&plStack_58->filepath == LYS_INPUT && ((options & 0x10U) != 0)))) break;
    } while ((*(LYS_NODE *)&plStack_58->filepath != LYS_OUTPUT) || ((options & 0x20U) == 0));
    plVar1 = plStack_58;
    if (plStack_58 == (lys_module *)0x0) {
      plStack_58 = (lys_module *)0x0;
      goto LAB_00164437;
    }
  }
  mod_local = plVar1;
  plStack_58 = (lys_module *)0x0;
  do {
    plStack_58 = (lys_module *)lys_getnext((lys_node *)plStack_58,(lys_node *)mod_local,mod,0);
    if (plStack_58 == (lys_module *)0x0) break;
    iVar2 = lyb_has_schema_model((lys_node *)plStack_58,lybs->models,lybs->mod_count);
  } while ((iVar2 == 0) ||
          (iVar2 = lyb_is_schema_hash_match((lys_node *)plStack_58,local_5f,sibling._7_1_ + 1),
          iVar2 == 0));
LAB_00164437:
  *snode = (lys_node *)plStack_58;
  if ((plStack_58 == (lys_module *)0x0) && ((options & 0x200U) != 0)) {
    if (mod == (lys_module *)0x0) {
      ly_vlog(lybs->ctx,LYE_SPEC,LY_VLOG_LYS,mod_local,
              "Failed to find matching hash for a child of \"%s\".",mod_local->ctx);
    }
    else {
      ly_vlog(lybs->ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Failed to find matching hash for a top-level node from \"%s\".",mod->name);
    }
    sparent_local._4_4_ = -1;
  }
  else {
    sparent_local._4_4_ = local_48;
  }
  return sparent_local._4_4_;
}

Assistant:

static int
lyb_parse_schema_hash(const struct lys_node *sparent, const struct lys_module *mod, const char *data, const char *yang_data_name,
                      int options, struct lys_node **snode, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t i, j;
    struct lys_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];

    assert((sparent || mod) && (!sparent || !mod));

    /* read the first hash */
    ret += (r = lyb_read(data, &hash[0], sizeof *hash, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* based on the first hash read all the other ones, if any */
    for (i = 0; !(hash[0] & (LYB_HASH_COLLISION_ID >> i)); ++i) {
        if (i > LYB_HASH_BITS) {
            return -1;
        }
    }

    /* move the first hash on its accurate position */
    hash[i] = hash[0];

    /* read the rest of hashes */
    for (j = i; j; --j) {
        ret += (r = lyb_read(data, &hash[j - 1], sizeof *hash, lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);

        /* correct collision ID */
        assert(hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1)));
        /* preceded with zeros */
        assert(!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1)))));
    }

    /* handle yang data templates */
    if ((options & LYD_OPT_DATA_TEMPLATE) && yang_data_name && mod) {
        sparent = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
        if (!sparent) {
            sibling = NULL;
            goto finish;
        }
    }

    /* handle RPC/action input/output */
    if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
        sibling = NULL;
        while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, NULL, LYS_GETNEXT_WITHINOUT))) {
            if ((sibling->nodetype == LYS_INPUT) && (options & LYD_OPT_RPC)) {
                break;
            }
            if ((sibling->nodetype == LYS_OUTPUT) && (options & LYD_OPT_RPCREPLY)) {
                break;
            }
        }
        if (!sibling) {
            /* fail */
            goto finish;
        }

        /* use only input/output children nodes */
        sparent = sibling;
    }

    /* find our node with matching hashes */
    sibling = NULL;
    while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, mod, 0))) {
        /* skip schema nodes from models not present during printing */
        if (lyb_has_schema_model(sibling, lybs->models, lybs->mod_count) && lyb_is_schema_hash_match(sibling, hash, i + 1)) {
            /* match found */
            break;
        }
    }

finish:
    *snode = sibling;
    if (!sibling && (options & LYD_OPT_STRICT)) {
        if (mod) {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to find matching hash for a top-level node from \"%s\".",
                    mod->name);
        } else {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_LYS, sparent, "Failed to find matching hash for a child of \"%s\".",
                    sparent->name);
        }
        return -1;
    }

    return ret;
}